

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O0

void __thiscall
libtorrent::storage_moved_failed_alert::~storage_moved_failed_alert
          (storage_moved_failed_alert *this)

{
  storage_moved_failed_alert *this_local;
  
  ~storage_moved_failed_alert(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

struct TORRENT_EXPORT storage_moved_failed_alert final : torrent_alert
	{
		// internal
		TORRENT_UNEXPORT storage_moved_failed_alert(aux::stack_allocator& alloc
			, torrent_handle const& h, error_code const& e, string_view file
			, operation_t op);

		TORRENT_DEFINE_ALERT_PRIO(storage_moved_failed_alert, 34, alert_priority::critical)

		static inline constexpr alert_category_t static_category = alert_category::storage;
		std::string message() const override;

		error_code const error;

		// If the error happened for a specific file, this returns its path.
		char const* file_path() const;

		// this indicates what underlying operation caused the error
		operation_t op;
	private:
		aux::allocation_slot m_file_idx;
#if TORRENT_ABI_VERSION == 1
	public:
		TORRENT_DEPRECATED char const* operation;
		// If the error happened for a specific file, ``file`` is its path.
		TORRENT_DEPRECATED std::string file;
#endif
	}